

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial_forceExtDict
              (char *source,char *dest,int compressedSize,int targetOutputSize,int dstCapacity,
              void *dictStart,size_t dictSize)

{
  byte *pbVar1;
  byte bVar2;
  undefined8 uVar3;
  ushort uVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  char cVar8;
  ushort *__src;
  size_t __n;
  BYTE *s;
  ushort *puVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  int iVar13;
  BYTE *d;
  char *__dest;
  ulong uVar14;
  ulong __n_00;
  long lStack_a0;
  int local_78;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar13 = -1;
  if (-1 < dstCapacity && source != (char *)0x0) {
    lVar6 = dictSize + (long)dictStart;
    if (dictStart == (void *)0x0) {
      lVar6 = 0;
    }
    if (dstCapacity == 0) {
      iVar13 = 0;
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      pcVar11 = dest + (uint)dstCapacity;
      __dest = dest;
      puVar9 = (ushort *)source;
LAB_00114b77:
      __src = (ushort *)((long)puVar9 + 1);
      bVar2 = (byte)*puVar9;
      uVar7 = (ulong)(uint)(bVar2 >> 4);
      if (bVar2 >> 4 == 0xf) {
        lStack_a0 = -1;
        if (__src < pbVar1 + -0xf) {
          lStack_a0 = 0;
          puVar9 = puVar9 + 1;
          do {
            __src = puVar9;
            if (pbVar1 + -0xf < __src) {
              lStack_a0 = -1;
              break;
            }
            lStack_a0 = lStack_a0 + (ulong)*(byte *)((long)__src + -1);
            puVar9 = (ushort *)((long)__src + 1);
          } while ((ulong)*(byte *)((long)__src + -1) == 0xff);
        }
        cVar8 = '\x05';
        uVar7 = 0xf;
        if ((lStack_a0 != -1) && (uVar7 = lStack_a0 + 0xf, !CARRY8((ulong)__dest,uVar7))) {
          cVar8 = CARRY8((ulong)__src,uVar7) * '\x05';
        }
        if (cVar8 != '\0') {
          if (cVar8 != '\x05') {
            return (int)__src;
          }
          goto LAB_00114f56;
        }
LAB_00114bf1:
        pcVar10 = __dest + uVar7;
        if ((pcVar11 + -0xc < pcVar10) ||
           (puVar9 = (ushort *)(uVar7 + (long)__src), pbVar1 + -8 < puVar9)) {
          if (pbVar1 < (byte *)(uVar7 + (long)__src)) {
            pcVar10 = __dest + ((long)pbVar1 - (long)__src);
            uVar7 = (long)pbVar1 - (long)__src;
          }
          __n = (long)pcVar11 - (long)__dest;
          if (pcVar10 <= pcVar11) {
            __n = uVar7;
          }
          memmove(__dest,__src,__n);
          __dest = __dest + __n;
          if ((pcVar11 <= pcVar10) ||
             (puVar9 = (ushort *)((long)__src + __n), pcVar10 = __dest, pbVar1 + -2 <= puVar9))
          goto LAB_00114f66;
        }
        else {
          do {
            *(undefined8 *)__dest = *(undefined8 *)__src;
            __dest = __dest + 8;
            __src = __src + 4;
          } while (__dest < pcVar10);
        }
        uVar5 = (uint)*puVar9;
        __src = puVar9 + 1;
        pcVar12 = pcVar10 + -(ulong)*puVar9;
        uVar14 = (ulong)(bVar2 & 0xf);
      }
      else {
        if ((source + (long)compressedSize + -0x10 <= __src) ||
           (dest + ((ulong)(uint)dstCapacity - 0x20) < __dest)) goto LAB_00114bf1;
        uVar3 = *(undefined8 *)((long)puVar9 + 9);
        *(undefined8 *)__dest = *(undefined8 *)__src;
        *(undefined8 *)(__dest + 8) = uVar3;
        pcVar10 = __dest + uVar7;
        uVar14 = (ulong)(bVar2 & 0xf);
        puVar9 = (ushort *)(uVar7 + (long)__src);
        __src = puVar9 + 1;
        uVar4 = *puVar9;
        uVar5 = (uint)uVar4;
        pcVar12 = pcVar10 + -(ulong)uVar4;
        if (((uVar14 != 0xf) && (7 < uVar4)) && (dest <= pcVar12)) {
          *(undefined8 *)pcVar10 = *(undefined8 *)pcVar12;
          *(undefined8 *)(pcVar10 + 8) = *(undefined8 *)(pcVar12 + 8);
          *(undefined2 *)(pcVar10 + 0x10) = *(undefined2 *)(pcVar12 + 0x10);
          __dest = pcVar10 + uVar14 + 4;
          puVar9 = __src;
          goto LAB_00114b77;
        }
      }
      if ((int)uVar14 == 0xf) {
        lStack_a0 = 0;
        puVar9 = __src;
        do {
          __src = (ushort *)((long)puVar9 + 1);
          if (pbVar1 + -4 < __src) {
            lStack_a0 = -1;
            break;
          }
          uVar4 = *puVar9;
          lStack_a0 = lStack_a0 + (ulong)(byte)uVar4;
          puVar9 = __src;
        } while ((ulong)(byte)uVar4 == 0xff);
        uVar14 = lStack_a0 + 0xf;
        if ((lStack_a0 == -1) || (CARRY8((ulong)pcVar10,uVar14))) goto LAB_00114f56;
      }
      if ((dictSize < 0x10000) && (pcVar12 + dictSize < dest)) {
LAB_00114f56:
        local_78 = (int)source;
        return ~(uint)__src + local_78;
      }
      uVar14 = uVar14 + 4;
      __dest = pcVar10 + uVar14;
      puVar9 = __src;
      if (pcVar12 < dest) {
        if ((pcVar11 + -5 < __dest) && ((ulong)((long)pcVar11 - (long)pcVar10) <= uVar14)) {
          uVar14 = (long)pcVar11 - (long)pcVar10;
        }
        __n_00 = (long)dest - (long)pcVar12;
        uVar7 = uVar14 - __n_00;
        if (uVar14 < __n_00 || uVar7 == 0) {
          memmove(pcVar10,(void *)(lVar6 - __n_00),uVar14);
          __dest = pcVar10 + uVar14;
        }
        else {
          memcpy(pcVar10,(void *)(lVar6 - __n_00),__n_00);
          __dest = pcVar10 + __n_00;
          if ((ulong)((long)__dest - (long)dest) < uVar7) {
            if ((long)__n_00 < (long)uVar14) {
              pcVar12 = dest;
              do {
                cVar8 = *pcVar12;
                pcVar12 = pcVar12 + 1;
                *__dest = cVar8;
                __dest = __dest + 1;
              } while (__dest < pcVar10 + uVar14);
            }
          }
          else {
            memcpy(__dest,dest,uVar7);
            __dest = pcVar10 + uVar14;
          }
        }
        goto LAB_00114b77;
      }
      if (__dest <= pcVar11 + -0xc) {
        if (uVar5 < 8) {
          pcVar10[0] = '\0';
          pcVar10[1] = '\0';
          pcVar10[2] = '\0';
          pcVar10[3] = '\0';
          *pcVar10 = *pcVar12;
          pcVar10[1] = pcVar12[1];
          pcVar10[2] = pcVar12[2];
          pcVar10[3] = pcVar12[3];
          uVar7 = (ulong)*(uint *)((long)inc32table + (ulong)(uVar5 << 2));
          *(undefined4 *)(pcVar10 + 4) = *(undefined4 *)(pcVar12 + uVar7);
          pcVar12 = pcVar12 + (uVar7 - (long)*(int *)((long)dec64table + (ulong)(uVar5 << 2)));
        }
        else {
          *(undefined8 *)pcVar10 = *(undefined8 *)pcVar12;
          pcVar12 = pcVar12 + 8;
        }
        *(undefined8 *)(pcVar10 + 8) = *(undefined8 *)pcVar12;
        if (0x10 < uVar14) {
          pcVar10 = pcVar10 + 0x10;
          do {
            pcVar12 = pcVar12 + 8;
            *(undefined8 *)pcVar10 = *(undefined8 *)pcVar12;
            pcVar10 = pcVar10 + 8;
          } while (pcVar10 < __dest);
        }
        goto LAB_00114b77;
      }
      uVar7 = (long)pcVar11 - (long)pcVar10;
      if (uVar14 < (ulong)((long)pcVar11 - (long)pcVar10)) {
        uVar7 = uVar14;
      }
      __dest = pcVar10 + uVar7;
      if (pcVar10 < pcVar12 + uVar7) {
        if (0 < (long)uVar7) {
          do {
            cVar8 = *pcVar12;
            pcVar12 = pcVar12 + 1;
            *pcVar10 = cVar8;
            pcVar10 = pcVar10 + 1;
          } while (pcVar10 < __dest);
        }
      }
      else {
        memcpy(pcVar10,pcVar12,uVar7);
      }
      if (__dest != pcVar11) goto LAB_00114b77;
LAB_00114f66:
      iVar13 = (int)__dest - (int)dest;
    }
  }
  return iVar13;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int targetOutputSize, int dstCapacity,
                                     const void* dictStart, size_t dictSize)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(source, dest, compressedSize, dstCapacity,
                                  partial_decode, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}